

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall wabt::Var::set_name(Var *this,string_view name)

{
  string_view local_40;
  string local_30;
  
  local_40.size_ = name.size_;
  local_40.data_ = name.data_;
  string_view::to_string_abi_cxx11_(&local_30,&local_40);
  set_name(this,&local_30);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void Var::set_name(string_view name) {
  set_name(name.to_string());
}